

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_count_scanner.cpp
# Opt level: O2

void __thiscall duckdb::ColumnCountResult::InternalAddRow(ColumnCountResult *this)

{
  reference pvVar1;
  mapped_type_conflict *pmVar2;
  idx_t iVar3;
  idx_t column_count;
  idx_t local_20;
  
  iVar3 = this->current_column_count + 1;
  local_20 = iVar3;
  pvVar1 = vector<duckdb::ColumnCount,_true>::get<true>(&this->column_counts,this->result_position);
  pvVar1->number_of_columns = iVar3;
  pmVar2 = ::std::
           map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ::operator[](&this->rows_per_column_count,&local_20);
  *pmVar2 = *pmVar2 + 1;
  this->current_column_count = 0;
  return;
}

Assistant:

inline void ColumnCountResult::InternalAddRow() {
	const idx_t column_count = current_column_count + 1;
	column_counts[result_position].number_of_columns = column_count;
	rows_per_column_count[column_count]++;
	current_column_count = 0;
}